

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

void pythonEntityDecl(void *user_data,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                     xmlChar *content)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  
  iVar1 = PyObject_HasAttrString(user_data,"entityDecl");
  if (iVar1 != 0) {
    plVar2 = (long *)_PyObject_CallMethod_SizeT
                               (user_data,"entityDecl","sisss",name,type,publicId,systemId,content);
    lVar3 = PyErr_Occurred();
    if (lVar3 != 0) {
      PyErr_Print();
    }
    if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
      _Py_Dealloc(plVar2);
      return;
    }
  }
  return;
}

Assistant:

static void
pythonEntityDecl(void *user_data,
                 const xmlChar * name,
                 int type,
                 const xmlChar * publicId,
                 const xmlChar * systemId, xmlChar * content)
{
    PyObject *handler;
    PyObject *result;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "entityDecl")) {
        result = PyObject_CallMethod(handler, (char *) "entityDecl",
                                     (char *) "sisss", name, type,
                                     publicId, systemId, content);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}